

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpTest_Local_Trace_Test::TestBody(InterpTest_Local_Trace_Test *this)

{
  pointer pRVar1;
  pointer pVVar2;
  bool bVar3;
  char *message;
  Result result;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> buf;
  Ptr trap;
  Ptr func;
  MemoryStream stream;
  Values results;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  Result local_dc;
  Values local_d8;
  Ptr local_b8;
  Ptr local_98;
  undefined1 local_78 [16];
  pointer local_68;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> local_58;
  AssertHelper local_50;
  Values local_48;
  
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  local_68 = (pointer)0x0;
  local_78._0_8_ = operator_new(0x41);
  pRVar1 = (pointer)((long)&((pointer)(local_78._0_8_ + 0x40))->index + 1);
  local_68 = pRVar1;
  memcpy((void *)local_78._0_8_,&DAT_0027731e,0x41);
  local_78._8_8_ = pRVar1;
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  local_68 = (pointer)0x0;
  InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)local_78);
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  InterpTest::GetFuncExport(&local_98,&this->super_InterpTest,0);
  local_48.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.root_index_ = 0;
  local_b8.obj_ = (Trap *)0x0;
  local_b8.store_ = (Store *)0x0;
  wabt::MemoryStream::MemoryStream((MemoryStream *)local_78,(Stream *)0x0);
  local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_dc = wabt::interp::Func::Call
                       (&(local_98.obj_)->super_Func,&(this->super_InterpTest).store_,&local_d8,
                        &local_48,&local_b8,(Stream *)local_78);
  if (local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_e8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_e8.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&local_d8,"Result::Ok","result",(Enum *)&local_e8,&local_dc);
  if (local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      message = "";
    }
    else {
      message = (char *)((local_d8.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->field_0).i64_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0xfb,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
      local_e8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
              ._M_impl.super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
              ._M_impl.super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    wabt::MemoryStream::ReleaseOutputBuffer((MemoryStream *)local_78);
    InterpTest::ExpectBufferStrEq
              (&this->super_InterpTest,
               (OutputBuffer *)
               local_d8.
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
               .super__Vector_impl_data._M_start,
               "#0.    0: V:0  | alloca 4\n#0.    8: V:4  | i32.const 0\n#0.   16: V:5  | local.set $5, 0\n#0.   24: V:4  | i64.const 1\n#0.   36: V:5  | local.set $4, 1\n#0.   44: V:4  | f32.const 2\n#0.   52: V:5  | local.set $3, 2\n#0.   60: V:4  | f64.const 3\n#0.   72: V:5  | local.set $2, 3\n#0.   80: V:4  | drop_keep $4 $0\n#0.   92: V:0  | return\n"
              );
    pVVar2 = local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      if ((void *)((local_d8.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start)->field_0).i64_ != (void *)0x0) {
        operator_delete((void *)((local_d8.
                                  super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->field_0).i64_);
      }
      operator_delete(pVVar2);
    }
  }
  local_78._0_8_ = &PTR__MemoryStream_002d70c8;
  if (local_58._M_t.
      super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
      super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
      super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>)0x0) {
    if (*(void **)local_58._M_t.
                  super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                  .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl != (void *)0x0) {
      operator_delete(*(void **)local_58._M_t.
                                super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                                .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl);
    }
    operator_delete((void *)local_58._M_t.
                            super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                            .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl);
  }
  if (local_b8.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_b8.store_,local_b8.root_index_);
    local_b8.obj_ = (Trap *)0x0;
    local_b8.store_ = (Store *)0x0;
    local_b8.root_index_ = 0;
  }
  if (local_48.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.obj_ != (DefinedFunc *)0x0) {
    wabt::interp::Store::DeleteRoot(local_98.store_,local_98.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpTest, Local_Trace) {
  // (func (export "a")
  //   (local i32 i64 f32 f64)
  //   (local.set 0 (i32.const 0))
  //   (local.set 1 (i64.const 1))
  //   (local.set 2 (f32.const 2))
  //   (local.set 3 (f64.const 3)))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x04, 0x01,
      0x60, 0x00, 0x00, 0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01,
      0x61, 0x00, 0x00, 0x0a, 0x26, 0x01, 0x24, 0x04, 0x01, 0x7f, 0x01,
      0x7e, 0x01, 0x7d, 0x01, 0x7c, 0x41, 0x00, 0x21, 0x00, 0x42, 0x01,
      0x21, 0x01, 0x43, 0x00, 0x00, 0x00, 0x40, 0x21, 0x02, 0x44, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40, 0x21, 0x03, 0x0b,
  });

  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  MemoryStream stream;
  Result result = func->Call(store_, {}, results, &trap, &stream);
  ASSERT_EQ(Result::Ok, result);

  auto buf = stream.ReleaseOutputBuffer();
  ExpectBufferStrEq(*buf,
R"(#0.    0: V:0  | alloca 4
#0.    8: V:4  | i32.const 0
#0.   16: V:5  | local.set $5, 0
#0.   24: V:4  | i64.const 1
#0.   36: V:5  | local.set $4, 1
#0.   44: V:4  | f32.const 2
#0.   52: V:5  | local.set $3, 2
#0.   60: V:4  | f64.const 3
#0.   72: V:5  | local.set $2, 3
#0.   80: V:4  | drop_keep $4 $0
#0.   92: V:0  | return
)");
}